

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader_halfedge.h
# Opt level: O0

GLfloat * __thiscall CMU462::ObjLoaderHalfedgeMesh::getData(ObjLoaderHalfedgeMesh *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Size SVar6;
  ulong uVar7;
  GLfloat *pGVar8;
  pointer pFVar9;
  HalfedgeIter *pHVar10;
  pointer pHVar11;
  VertexIter *pVVar12;
  pointer pVVar13;
  ulong local_88;
  size_t j;
  GLfloat color3;
  GLfloat color2;
  GLfloat color1;
  Vector3D pos3;
  Vector3D pos2;
  Vector3D pos1;
  _Self local_20;
  FaceIter f;
  size_t i;
  ObjLoaderHalfedgeMesh *this_local;
  
  SVar6 = HalfedgeMesh::nFaces(this->mesh);
  this->nf = (GLint)SVar6;
  if ((this->isData & 1U) == 0) {
    this->isData = true;
  }
  else if (this->vertices != (GLfloat *)0x0) {
    operator_delete__(this->vertices);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->nf * 0x12);
  uVar7 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pGVar8 = (GLfloat *)operator_new__(uVar7);
  this->vertices = pGVar8;
  f._M_node = (_List_node_base *)0x0;
  local_20._M_node = (_List_node_base *)HalfedgeMesh::facesBegin(this->mesh);
  while( true ) {
    pos1.z = (double)HalfedgeMesh::facesEnd(this->mesh);
    bVar2 = std::operator!=(&local_20,(_Self *)&pos1.z);
    if (!bVar2) break;
    pFVar9 = std::_List_iterator<CMU462::Face>::operator->(&local_20);
    pHVar10 = Face::halfedge(pFVar9);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar10);
    pVVar12 = Halfedge::vertex(pHVar11);
    pVVar13 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar12);
    Vector3D::Vector3D((Vector3D *)&pos2.z,&pVVar13->position);
    pFVar9 = std::_List_iterator<CMU462::Face>::operator->(&local_20);
    pHVar10 = Face::halfedge(pFVar9);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar10);
    pHVar10 = Halfedge::next(pHVar11);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar10);
    pVVar12 = Halfedge::vertex(pHVar11);
    pVVar13 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar12);
    Vector3D::Vector3D((Vector3D *)&pos3.z,&pVVar13->position);
    pFVar9 = std::_List_iterator<CMU462::Face>::operator->(&local_20);
    pHVar10 = Face::halfedge(pFVar9);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar10);
    pHVar10 = Halfedge::next(pHVar11);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar10);
    pHVar10 = Halfedge::next(pHVar11);
    pHVar11 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar10);
    pVVar12 = Halfedge::vertex(pHVar11);
    pVVar13 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar12);
    Vector3D::Vector3D((Vector3D *)&color2,&pVVar13->position);
    this->vertices[(long)f._M_node * 0x12] = (float)pos2.z;
    this->vertices[(long)f._M_node * 0x12 + 1] = (float)pos1.x;
    this->vertices[(long)f._M_node * 0x12 + 2] = (float)pos1.y;
    this->vertices[(long)f._M_node * 0x12 + 6] = (float)pos3.z;
    this->vertices[(long)f._M_node * 0x12 + 7] = (float)pos2.x;
    this->vertices[(long)f._M_node * 0x12 + 8] = (float)pos2.y;
    this->vertices[(long)f._M_node * 0x12 + 0xc] = (float)_color2;
    this->vertices[(long)f._M_node * 0x12 + 0xd] = (float)pos3.x;
    this->vertices[(long)f._M_node * 0x12 + 0xe] = (float)pos3.y;
    iVar3 = rand();
    iVar4 = rand();
    iVar5 = rand();
    for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
      this->vertices[(long)f._M_node * 0x12 + local_88 * 6 + 3] = (float)iVar3 / 2.1474836e+09;
      this->vertices[(long)f._M_node * 0x12 + local_88 * 6 + 4] = (float)iVar4 / 2.1474836e+09;
      this->vertices[(long)f._M_node * 0x12 + local_88 * 6 + 5] = (float)iVar5 / 2.1474836e+09;
    }
    std::_List_iterator<CMU462::Face>::operator++(&local_20,0);
    f._M_node = (_List_node_base *)((long)&(f._M_node)->_M_next + 1);
  }
  return this->vertices;
}

Assistant:

GLfloat* getData() {
        // Generate new vertices.
        nf = mesh->nFaces();
        if (isData) {
            delete[] vertices;
        } else {
            isData = true;
        }
        vertices = new GLfloat[STRIDE * nf];

        size_t i = 0;
        for (auto f = mesh->facesBegin(); f != mesh->facesEnd(); f++, i++) {
            auto pos1 = f->halfedge()->vertex()->position;
            auto pos2 = f->halfedge()->next()->vertex()->position;
            auto pos3 = f->halfedge()->next()->next()->vertex()->position;

            vertices[STRIDE * i    ]  = pos1.x;
            vertices[STRIDE * i + 1]  = pos1.y;
            vertices[STRIDE * i + 2]  = pos1.z;

            vertices[STRIDE * i + NUM_ATTR    ]  = pos2.x;
            vertices[STRIDE * i + NUM_ATTR + 1]  = pos2.y;
            vertices[STRIDE * i + NUM_ATTR + 2]  = pos2.z;

            vertices[STRIDE * i + NUM_ATTR * 2    ] = pos3.x;
            vertices[STRIDE * i + NUM_ATTR * 2 + 1] = pos3.y;
            vertices[STRIDE * i + NUM_ATTR * 2 + 2] = pos3.z;

            GLfloat color1 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color2 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color3 = static_cast<double>(rand()) / RAND_MAX;
            for (size_t j = 0; j < 3; ++j) {
                vertices[STRIDE * i + NUM_ATTR * j + 3] = color1;
                vertices[STRIDE * i + NUM_ATTR * j + 4] = color2;
                vertices[STRIDE * i + NUM_ATTR * j + 5] = color3;
            }
        }

        return vertices;
    }